

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  CURLcode CVar7;
  uint uVar8;
  CURLUcode CVar9;
  CURLUcode CVar10;
  size_t sVar11;
  Curl_handler *pCVar12;
  char *pcVar13;
  size_t sVar14;
  char *pcVar15;
  void *pvVar16;
  uint uVar17;
  long lVar18;
  size_t buflen;
  long lVar19;
  _Bool relative;
  ulong uVar20;
  char **mem;
  char *pcVar21;
  uchar *i;
  bool bVar22;
  size_t sStack_b0;
  uint local_a4;
  CURLU *local_a0;
  curl_off_t port;
  char *decoded;
  uint local_5c;
  char *oldurl;
  char *part_local;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  uVar20 = (ulong)what;
  part_local = part;
  if (part == (char *)0x0) {
    switch(uVar20) {
    case 0:
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      *(undefined8 *)&u->portnum = 0;
      return CURLUE_OK;
    case 1:
      u->field_0x52 = u->field_0x52 & 0xfb;
      break;
    case 2:
      u = (CURLU *)&u->user;
      break;
    case 3:
      u = (CURLU *)&u->password;
      break;
    case 4:
      u = (CURLU *)&u->options;
      break;
    case 5:
      u = (CURLU *)&u->host;
      break;
    case 6:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case 7:
      u = (CURLU *)&u->path;
      break;
    case 8:
      u->field_0x52 = u->field_0x52 & 0xfe;
      u = (CURLU *)&u->query;
      break;
    case 9:
      u->field_0x52 = u->field_0x52 & 0xfd;
      u = (CURLU *)&u->fragment;
      break;
    case 10:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  sVar11 = strlen(part);
  if (8000000 < sVar11) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (CURLUPART_ZONEID < what) {
    return CURLUE_UNKNOWN_PART;
  }
  bVar4 = (byte)flags >> 7;
  switch(uVar20) {
  case 0:
    if (sVar11 == 0) {
      CVar9 = CURLUE_OK;
      CVar10 = curl_url_get(u,CURLUPART_URL,&oldurl,flags);
      if (CVar10 != CURLUE_OK) {
        return CURLUE_MALFORMED_INPUT;
      }
      pvVar16 = (void *)CONCAT53(oldurl._3_5_,CONCAT12(oldurl._2_1_,oldurl._0_2_));
      goto LAB_00161954;
    }
    sVar14 = Curl_is_absolute_url(part,(char *)0x0,buflen,(flags & 0x204) != 0);
    if ((sVar14 != 0) || (CVar9 = curl_url_get(u,CURLUPART_URL,&oldurl,flags), CVar9 != CURLUE_OK))
    {
      CVar9 = parseurl_and_replace(part,u,flags);
      return CVar9;
    }
    pcVar13 = (char *)CONCAT53(oldurl._3_5_,CONCAT12(oldurl._2_1_,oldurl._0_2_));
    sVar11 = strlen(u->scheme);
    if (pcVar13 == (char *)0x0) {
      CVar9 = CURLUE_MALFORMED_INPUT;
      pvVar16 = (void *)0x0;
      goto LAB_00161954;
    }
    pcVar21 = pcVar13 + sVar11 + 3;
    cVar5 = *part;
    if (cVar5 == '#') {
      if (u->fragment != (char *)0x0) {
        iVar6 = 0x23;
LAB_00161878:
        pcVar15 = strchr(pcVar21,iVar6);
LAB_0016188a:
        relative = true;
        if (pcVar15 != (char *)0x0) goto LAB_001618c3;
      }
LAB_001618c8:
      sVar11 = strlen(pcVar13);
      relative = true;
    }
    else {
      if (cVar5 == '/') {
        if (part[1] != '/') {
          iVar6 = 0x2f;
          goto LAB_00161878;
        }
        part = part + 2;
        relative = false;
        pcVar15 = pcVar21;
      }
      else {
        if ((u->query == (char *)0x0) || (*u->query == '\0')) {
          if ((u->fragment != (char *)0x0) && (*u->fragment != '\0')) {
            iVar6 = 0x23;
            goto LAB_0016186b;
          }
          pcVar15 = (char *)0x0;
        }
        else {
          iVar6 = 0x3f;
LAB_0016186b:
          pcVar15 = strchr(pcVar21,iVar6);
        }
        if (cVar5 == '?') goto LAB_0016188a;
        if (pcVar15 == (char *)0x0) {
          sVar11 = strlen(pcVar21);
        }
        else {
          sVar11 = (long)pcVar15 - (long)pcVar21;
        }
        pvVar16 = memrchr(pcVar21,0x2f,sVar11);
        if (pvVar16 == (void *)0x0) goto LAB_001618c8;
        pcVar15 = (char *)((long)pvVar16 + 1);
        relative = true;
      }
LAB_001618c3:
      sVar11 = (long)pcVar15 - (long)pcVar13;
    }
    Curl_dyn_init((dynbuf *)&port,8000000);
    CVar7 = Curl_dyn_addn((dynbuf *)&port,pcVar13,sVar11);
    CVar9 = CURLUE_OUT_OF_MEMORY;
    if (CVar7 == CURLE_OK) {
      sVar11 = strlen(part);
      CVar10 = urlencode_str((dynbuf *)&port,part,sVar11,relative,false);
      if (CVar10 == CURLUE_OK) {
        pcVar13 = Curl_dyn_ptr((dynbuf *)&port);
        CVar9 = parseurl_and_replace(pcVar13,u,flags & 0xffffffef);
      }
    }
    Curl_dyn_free((dynbuf *)&port);
    pvVar16 = (void *)CONCAT53(oldurl._3_5_,CONCAT12(oldurl._2_1_,oldurl._0_2_));
LAB_00161954:
    (*Curl_cfree)(pvVar16);
    return CVar9;
  case 1:
    if (sVar11 - 0x29 < 0xffffffffffffffd8) {
      return CURLUE_BAD_SCHEME;
    }
    if (((flags & 8) == 0) &&
       (pCVar12 = Curl_get_scheme_handler(part), pCVar12 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    if (0x19 < (byte)((*part & 0xdfU) + 0xbf)) {
      return CURLUE_BAD_SCHEME;
    }
    for (lVar18 = 0; sVar11 - 1 != lVar18; lVar18 = lVar18 + 1) {
      bVar4 = part[lVar18];
      if ((9 < (byte)(bVar4 - 0x30)) && (0x19 < (byte)((bVar4 & 0xdf) + 0xbf))) {
        if (0x2e < bVar4) {
          return CURLUE_BAD_SCHEME;
        }
        if ((0x680000000000U >> ((ulong)bVar4 & 0x3f) & 1) == 0) {
          return CURLUE_BAD_SCHEME;
        }
      }
    }
    u->field_0x52 = u->field_0x52 & 0xfb;
    bVar22 = true;
    local_a4 = 0;
    uVar17 = 0;
    bVar4 = 0;
    local_a0 = u;
    goto LAB_0016137a;
  case 2:
    local_a0 = (CURLU *)&u->user;
    break;
  case 3:
    local_a0 = (CURLU *)&u->password;
    break;
  case 4:
    local_a0 = (CURLU *)&u->options;
    break;
  case 5:
    local_a0 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case 6:
    if (9 < (byte)(*part - 0x30U)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    iVar6 = Curl_str_number(&part_local,&port,0xffff);
    if (iVar6 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*part_local != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar13 = curl_maprintf("%ld",CONCAT62(port._2_6_,(unsigned_short)port));
    if (pcVar13 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(u->port);
    u->port = pcVar13;
    u->portnum = (unsigned_short)port;
    return CURLUE_OK;
  case 7:
    local_a0 = (CURLU *)&u->path;
    uVar17 = (uint)CONCAT71((int7)((ulong)((long)&switchD_00161119::switchdataD_0017db98 +
                                          (long)(int)(&switchD_00161119::switchdataD_0017db98)
                                                     [uVar20]) >> 8),1);
    local_a4 = 0;
    bVar22 = true;
    goto LAB_0016137a;
  case 8:
    bVar22 = -1 < (char)(byte)flags;
    local_a4 = flags >> 8;
    local_a0 = (CURLU *)&u->query;
    u->field_0x52 = u->field_0x52 | 1;
    goto LAB_00161378;
  case 9:
    u->field_0x52 = u->field_0x52 | 2;
    local_a0 = (CURLU *)&u->fragment;
    break;
  case 10:
    local_a0 = (CURLU *)&u->zoneid;
  }
  bVar22 = true;
  local_a4 = 0;
LAB_00161378:
  uVar17 = 0;
LAB_0016137a:
  local_5c = uVar17;
  Curl_dyn_init((dynbuf *)&port,(ulong)(uVar17 & 0xff) + sVar11 * 3 + 1);
  if (((char)uVar17 != '\0') && (*part != '/')) {
    CVar7 = Curl_dyn_addn((dynbuf *)&port,"/",1);
    CVar9 = CURLUE_OUT_OF_MEMORY;
    if (CVar7 == CURLE_TOO_LARGE) {
      CVar9 = CURLUE_TOO_LARGE;
    }
    if (CVar7 != CURLE_OK) {
      return CVar9;
    }
  }
  if (bVar4 == 0) {
    CVar7 = Curl_dyn_add((dynbuf *)&port,part);
    if (CVar7 != CURLE_OK) {
      if (CVar7 == CURLE_TOO_LARGE) {
        return CURLUE_TOO_LARGE;
      }
      return CURLUE_OUT_OF_MEMORY;
    }
    pcVar13 = Curl_dyn_ptr((dynbuf *)&port);
    lVar18 = 1;
    do {
      lVar19 = lVar18;
      if (*pcVar13 == '%') {
        bVar1 = pcVar13[1];
        if (((((byte)(bVar1 - 0x30) < 10) ||
             ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))
             ) && ((bVar2 = pcVar13[2], (byte)(bVar2 - 0x30) < 10 ||
                   ((bVar2 - 0x41 < 0x26 &&
                    ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))))) &&
           ((byte)(bVar1 + 0xbf) < 0x1a || (byte)(bVar2 + 0xbf) < 0x1a)) {
          cVar5 = Curl_raw_tolower(bVar1);
          pcVar13[1] = cVar5;
          cVar5 = Curl_raw_tolower(pcVar13[2]);
          pcVar13[2] = cVar5;
          lVar19 = 3;
        }
      }
      else if (*pcVar13 == '\0') goto LAB_0016158c;
      pcVar13 = pcVar13 + lVar19;
    } while( true );
  }
  uVar17 = local_a4;
  for (; bVar1 = *part, bVar1 != 0; part = (char *)((long)part + 1)) {
    if ((bool)(bVar1 != 0x20 | bVar22)) {
      if (((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
          (bVar1 - 0x2d < 2)) || (bVar1 == 0x7e)) {
LAB_0016147a:
        uVar8 = uVar17 & 0xff;
        uVar3 = uVar8;
        if ((uVar17 & 1) != 0) {
          uVar3 = 0;
        }
        uVar17 = uVar3;
        if (bVar1 != 0x3d) {
          uVar17 = uVar8;
        }
        sStack_b0 = 1;
        mem = (char **)part;
      }
      else {
        if (bVar1 == 0x3d) {
          if ((uVar17 & 1) != 0) goto LAB_0016147a;
        }
        else if ((bVar1 == 0x5f) || ((bVar1 == 0x2f && ((char)local_5c != '\0'))))
        goto LAB_0016147a;
        oldurl._2_1_ = 0;
        oldurl._0_2_ = 0x25;
        Curl_hexbyte((uchar *)((long)&oldurl + 1),bVar1,true);
        sStack_b0 = 3;
        mem = &oldurl;
      }
      CVar7 = Curl_dyn_addn((dynbuf *)&port,mem,sStack_b0);
      if (CVar7 != CURLE_OK) {
        if (CVar7 == CURLE_TOO_LARGE) {
          return CURLUE_TOO_LARGE;
        }
        return CURLUE_OUT_OF_MEMORY;
      }
    }
    else {
      CVar7 = Curl_dyn_addn((dynbuf *)&port,"+",1);
      if (CVar7 != CURLE_OK) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
  }
LAB_0016158c:
  pcVar13 = Curl_dyn_ptr((dynbuf *)&port);
  if (((byte)local_a4 & pcVar13 != (char *)0x0) == 1) {
    pcVar21 = u->query;
    if ((pcVar21 != (char *)0x0) && (sVar11 = strlen(pcVar21), sVar11 != 0)) {
      cVar5 = pcVar21[sVar11 - 1];
      Curl_dyn_init((dynbuf *)&oldurl,8000000);
      CVar7 = Curl_dyn_addn((dynbuf *)&oldurl,u->query,sVar11);
      if ((CVar7 == CURLE_OK) &&
         (((cVar5 == '&' || (CVar7 = Curl_dyn_addn((dynbuf *)&oldurl,"&",1), CVar7 == CURLE_OK)) &&
          (CVar7 = Curl_dyn_add((dynbuf *)&oldurl,pcVar13), CVar7 == CURLE_OK)))) {
        Curl_dyn_free((dynbuf *)&port);
        (*Curl_cfree)(local_a0->scheme);
        pcVar13 = Curl_dyn_ptr((dynbuf *)&oldurl);
        local_a0->scheme = pcVar13;
        return CURLUE_OK;
      }
      Curl_dyn_free((dynbuf *)&port);
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  else if ((what == CURLUPART_HOST) &&
          (sVar14 = Curl_dyn_len((dynbuf *)&port), ((byte)(flags >> 10) & sVar14 == 0) == 0)) {
    if (sVar14 == 0) {
LAB_00161784:
      Curl_dyn_free((dynbuf *)&port);
      return CURLUE_BAD_HOSTNAME;
    }
    if (bVar4 == 0) {
      decoded = (char *)0x0;
      CVar7 = Curl_urldecode(pcVar13,sVar14,&decoded,(size_t *)&oldurl,REJECT_CTRL);
      if ((CVar7 != CURLE_OK) ||
         (CVar9 = hostname_check(u,decoded,
                                 CONCAT53(oldurl._3_5_,CONCAT12(oldurl._2_1_,oldurl._0_2_))),
         CVar9 != CURLUE_OK)) {
        (*Curl_cfree)(decoded);
        goto LAB_00161784;
      }
      (*Curl_cfree)(decoded);
    }
    else {
      CVar9 = hostname_check(u,pcVar13,sVar14);
      if (CVar9 != CURLUE_OK) goto LAB_00161784;
    }
  }
  (*Curl_cfree)(local_a0->scheme);
  local_a0->scheme = pcVar13;
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE) ? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      curl_off_t port;
      if(Curl_str_number(&part, &port, 0xffff) || *part)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = aprintf("%" CURL_FORMAT_CURL_OFF_T, port);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY) ? 1 : 0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode uc;
    char *oldurl;

    if(!nalloc) {
      /* a blank URL is not a valid URL unless we already have a complete one
         and this is a redirect */
      if(!curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
        /* success, meaning the "" is a fine relative URL, but nothing
           changes */
        free(oldurl);
        return CURLUE_OK;
      }
      return CURLUE_MALFORMED_INPUT;
    }

    /* if the new thing is absolute or the old one is not (we could not get an
     * absolute URL in 'oldurl'), then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }
    DEBUGASSERT(oldurl); /* it is set here */
    /* apply the relative part to create a new URL */
    uc = redirect_url(oldurl, part, u, flags);
    free(oldurl);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          unsigned char out[3]={'%'};
          Curl_hexbyte(&out[1], *i, TRUE);
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)CURL_UNCONST(newp), n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)CURL_UNCONST(newp);
  }
  return CURLUE_OK;
}